

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

FT_UInt FT_Get_Char_Index(FT_Face face,FT_ULong charcode)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = 0;
  if ((face != (FT_Face)0x0) && (uVar2 = 0, face->charmap != (FT_CharMap)0x0)) {
    uVar1 = (*(code *)(face->charmap[1].face)->style_flags)();
    uVar2 = 0;
    if (uVar1 < (uint)face->num_glyphs) {
      uVar2 = uVar1;
    }
  }
  return uVar2;
}

Assistant:

FT_EXPORT_DEF( FT_UInt )
  FT_Get_Char_Index( FT_Face   face,
                     FT_ULong  charcode )
  {
    FT_UInt  result = 0;


    if ( face && face->charmap )
    {
      FT_CMap  cmap = FT_CMAP( face->charmap );


      if ( charcode > 0xFFFFFFFFUL )
      {
        FT_TRACE1(( "FT_Get_Char_Index: too large charcode" ));
        FT_TRACE1(( " 0x%x is truncated\n", charcode ));
      }

      result = cmap->clazz->char_index( cmap, (FT_UInt32)charcode );
      if ( result >= (FT_UInt)face->num_glyphs )
        result = 0;
    }

    return result;
  }